

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O1

void __thiscall QTextHtmlParserNode::QTextHtmlParserNode(QTextHtmlParserNode *this)

{
  QBrush *this_00;
  int i;
  long lVar1;
  
  (this->children).d.d = (Data *)0x0;
  (this->children).d.ptr = (int *)0x0;
  lVar1 = 0;
  (this->children).d.size = 0;
  (this->tag).d.d = (Data *)0x0;
  (this->tag).d.ptr = (char16_t *)0x0;
  (this->tag).d.size = 0;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  (this->attributes).d.d = (Data *)0x0;
  (this->attributes).d.ptr = (QString *)0x0;
  *(undefined8 *)((long)&(this->attributes).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->attributes).d.size + 4) = 0;
  this->id = Html_unknown;
  QTextCharFormat::QTextCharFormat(&this->charFormat);
  QTextBlockFormat::QTextBlockFormat(&this->blockFormat);
  *(ushort *)&this->field_0x90 = (ushort)*(undefined4 *)&this->field_0x90 & 0xe000 | 0x200;
  this->listStyle = ListStyleUndefined;
  this->listStart = 1;
  (this->textListNumberPrefix).d.d = (Data *)0x0;
  (this->textListNumberPrefix).d.ptr = (char16_t *)0x0;
  (this->textListNumberPrefix).d.size = 0;
  (this->textListNumberSuffix).d.d = (Data *)0x0;
  (this->textListNumberSuffix).d.ptr = (char16_t *)0x0;
  (this->textListNumberSuffix).d.size = 0;
  (this->imageName).d.d = (Data *)0x0;
  (this->imageName).d.ptr = (char16_t *)0x0;
  (this->imageName).d.size = 0;
  (this->imageAlt).d.d = (Data *)0x0;
  (this->imageAlt).d.ptr = (char16_t *)0x0;
  (this->imageAlt).d.size = 0;
  this->imageWidth = -1.0;
  this->imageHeight = -1.0;
  (this->width).lengthType = VariableLength;
  (this->width).fixedValueOrPercentage = 0.0;
  (this->height).lengthType = VariableLength;
  (this->height).fixedValueOrPercentage = 0.0;
  this->tableBorder = 0.0;
  this->tableCellRowSpan = 1;
  this->tableCellColSpan = 1;
  this->tableCellSpacing = 2.0;
  this->tableCellPadding = 0.0;
  this_00 = (QBrush *)&this->field_0x170;
  do {
    QBrush::QBrush((QBrush *)((long)this_00 + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  QBrush::QBrush(&this->borderBrush,darkGray,SolidPattern);
  this->borderStyle = BorderStyle_Outset;
  this->borderCollapse = false;
  this->userState = -1;
  this->cssListIndent = 0;
  this->wsm = WhiteSpaceModeUndefined;
  this->margin[0] = 0;
  this->margin[1] = 0;
  this->margin[2] = 0;
  this->margin[3] = 0;
  lVar1 = 0;
  do {
    this->tableCellBorderStyle[lVar1] = BorderStyle_None;
    this_00[-4].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)0x0;
    QBrush::operator=(this_00,NoBrush);
    lVar1 = lVar1 + 1;
    this_00 = this_00 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

QTextHtmlParserNode::QTextHtmlParserNode()
    : parent(0), id(Html_unknown),
      cssFloat(QTextFrameFormat::InFlow), hasOwnListStyle(false), hasOwnLineHeightType(false), hasLineHeightMultiplier(false),
      hasCssListIndent(false), isEmptyParagraph(false), isTextFrame(false), isRootFrame(false),
      displayMode(QTextHtmlElement::DisplayInline), hasHref(false),
      listStyle(QTextListFormat::ListStyleUndefined), imageWidth(-1), imageHeight(-1), tableBorder(0),
      tableCellRowSpan(1), tableCellColSpan(1), tableCellSpacing(2), tableCellPadding(0),
      borderBrush(Qt::darkGray), borderStyle(QTextFrameFormat::BorderStyle_Outset),
      borderCollapse(false),
      userState(-1), cssListIndent(0), wsm(WhiteSpaceModeUndefined)
{
    margin[QTextHtmlParser::MarginLeft] = 0;
    margin[QTextHtmlParser::MarginRight] = 0;
    margin[QTextHtmlParser::MarginTop] = 0;
    margin[QTextHtmlParser::MarginBottom] = 0;

    for (int i = 0; i < 4; ++i) {
        tableCellBorderStyle[i] = QTextFrameFormat::BorderStyle_None;
        tableCellBorder[i] = 0;
        tableCellBorderBrush[i] = Qt::NoBrush;
    }
}